

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  StackItemT<embree::NodeRefPtr<4>_> *pSVar1;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar2;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar3;
  float *pfVar4;
  int iVar5;
  AccelData *pAVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  bool bVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  _func_int **pp_Var16;
  ulong uVar17;
  undefined4 uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  size_t sVar23;
  ulong uVar24;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar30 [64];
  vint4 ai;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 bi;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 bi_1;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 bi_2;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 bi_3;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  vint4 bi_5;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vint4 ai_2;
  vint4 bi_4;
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  vint<4> octant;
  vint4 bi_10;
  RTCIntersectFunctionNArguments local_11a8;
  Geometry *local_1178;
  undefined8 local_1170;
  RTCIntersectArguments *local_1168;
  undefined1 local_1158 [16];
  vfloat<4> fmin;
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [8];
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  undefined1 local_1008 [16];
  undefined1 local_ff8 [8];
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [8];
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [8];
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  undefined1 local_f98 [8];
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  auVar27 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar28 = vpcmpeqd_avx(auVar27,(undefined1  [16])valid_i->field_0);
  uVar13 = vmovmskps_avx(auVar28);
  if (uVar13 == 0) {
    return;
  }
  pAVar6 = This->ptr;
  uVar19 = (ulong)(uVar13 & 0xff);
  auVar63 = ZEXT1664(*(undefined1 (*) [16])ray);
  auVar64 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
  auVar65 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
  auVar49 = *(undefined1 (*) [16])(ray + 0x40);
  auVar46._8_4_ = 0x7fffffff;
  auVar46._0_8_ = 0x7fffffff7fffffff;
  auVar46._12_4_ = 0x7fffffff;
  auVar40 = vandps_avx(auVar49,auVar46);
  auVar57._8_4_ = 0x219392ef;
  auVar57._0_8_ = 0x219392ef219392ef;
  auVar57._12_4_ = 0x219392ef;
  auVar40 = vcmpps_avx(auVar40,auVar57,1);
  auVar48 = vblendvps_avx(auVar49,auVar57,auVar40);
  auVar40 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar46);
  auVar40 = vcmpps_avx(auVar40,auVar57,1);
  auVar47 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar57,auVar40);
  auVar40 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar46);
  auVar40 = vcmpps_avx(auVar40,auVar57,1);
  auVar40 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar57,auVar40);
  auVar46 = vrcpps_avx(auVar48);
  fVar7 = auVar46._0_4_;
  auVar53._0_4_ = auVar48._0_4_ * fVar7;
  fVar8 = auVar46._4_4_;
  auVar53._4_4_ = auVar48._4_4_ * fVar8;
  fVar9 = auVar46._8_4_;
  auVar53._8_4_ = auVar48._8_4_ * fVar9;
  fVar10 = auVar46._12_4_;
  auVar53._12_4_ = auVar48._12_4_ * fVar10;
  auVar61._8_4_ = 0x3f800000;
  auVar61._0_8_ = &DAT_3f8000003f800000;
  auVar61._12_4_ = 0x3f800000;
  auVar48 = vsubps_avx(auVar61,auVar53);
  local_10a8._0_4_ = fVar7 + fVar7 * auVar48._0_4_;
  local_10a8._4_4_ = fVar8 + fVar8 * auVar48._4_4_;
  local_10a8._8_4_ = fVar9 + fVar9 * auVar48._8_4_;
  local_10a8._12_4_ = fVar10 + fVar10 * auVar48._12_4_;
  auVar66 = ZEXT1664(local_10a8);
  auVar48 = vrcpps_avx(auVar47);
  fVar7 = auVar48._0_4_;
  auVar58._0_4_ = auVar47._0_4_ * fVar7;
  fVar8 = auVar48._4_4_;
  auVar58._4_4_ = auVar47._4_4_ * fVar8;
  fVar9 = auVar48._8_4_;
  auVar58._8_4_ = auVar47._8_4_ * fVar9;
  fVar10 = auVar48._12_4_;
  auVar58._12_4_ = auVar47._12_4_ * fVar10;
  auVar48 = vsubps_avx(auVar61,auVar58);
  local_10b8._0_4_ = fVar7 + fVar7 * auVar48._0_4_;
  local_10b8._4_4_ = fVar8 + fVar8 * auVar48._4_4_;
  local_10b8._8_4_ = fVar9 + fVar9 * auVar48._8_4_;
  local_10b8._12_4_ = fVar10 + fVar10 * auVar48._12_4_;
  auVar67 = ZEXT1664(local_10b8);
  auVar48 = vrcpps_avx(auVar40);
  fVar7 = auVar48._0_4_;
  auVar47._0_4_ = auVar40._0_4_ * fVar7;
  fVar8 = auVar48._4_4_;
  auVar47._4_4_ = auVar40._4_4_ * fVar8;
  fVar9 = auVar48._8_4_;
  auVar47._8_4_ = auVar40._8_4_ * fVar9;
  fVar10 = auVar48._12_4_;
  auVar47._12_4_ = auVar40._12_4_ * fVar10;
  auVar40 = vsubps_avx(auVar61,auVar47);
  local_10c8._0_4_ = fVar7 + fVar7 * auVar40._0_4_;
  local_10c8._4_4_ = fVar8 + fVar8 * auVar40._4_4_;
  local_10c8._8_4_ = fVar9 + fVar9 * auVar40._8_4_;
  local_10c8._12_4_ = fVar10 + fVar10 * auVar40._12_4_;
  auVar68 = ZEXT1664(local_10c8);
  auVar48 = ZEXT816(0) << 0x20;
  local_10d8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar48);
  local_10e8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar48);
  auVar49 = vcmpps_avx(auVar49,auVar48,1);
  auVar40._8_4_ = 1;
  auVar40._0_8_ = 0x100000001;
  auVar40._12_4_ = 1;
  auVar49 = vandps_avx(auVar49,auVar40);
  auVar40 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar48,1);
  auVar54._8_4_ = 2;
  auVar54._0_8_ = 0x200000002;
  auVar54._12_4_ = 2;
  auVar40 = vandps_avx(auVar40,auVar54);
  auVar40 = vorps_avx(auVar40,auVar49);
  auVar49 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar48,1);
  auVar48._8_4_ = 4;
  auVar48._0_8_ = 0x400000004;
  auVar48._12_4_ = 4;
  auVar49 = vandps_avx(auVar49,auVar48);
  auVar27 = vpor_avx(auVar28 ^ auVar27,auVar49);
  local_10f8 = vpor_avx(auVar27,auVar40);
  auVar62 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
  local_1078 = *(undefined1 (*) [16])ray;
  local_1088 = *(undefined1 (*) [16])(ray + 0x10);
  local_1098 = *(undefined1 (*) [16])(ray + 0x20);
LAB_0037bac3:
  lVar20 = 0;
  if (uVar19 != 0) {
    for (; (uVar19 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
    }
  }
  uVar18 = *(undefined4 *)(local_10f8 + lVar20 * 4);
  auVar27._4_4_ = uVar18;
  auVar27._0_4_ = uVar18;
  auVar27._8_4_ = uVar18;
  auVar27._12_4_ = uVar18;
  auVar53 = vpcmpeqd_avx(auVar27,local_10f8);
  uVar18 = vmovmskps_avx(auVar53);
  uVar19 = ~CONCAT44((int)((ulong)lVar20 >> 0x20),uVar18) & uVar19;
  auVar57 = auVar62._0_16_;
  auVar27 = vblendvps_avx(auVar57,auVar66._0_16_,auVar53);
  auVar28 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar28 = vminps_avx(auVar28,auVar27);
  auVar49 = vshufpd_avx(auVar28,auVar28,1);
  auVar27 = vblendvps_avx(auVar57,auVar67._0_16_,auVar53);
  auVar28 = vminps_avx(auVar49,auVar28);
  auVar49 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vminps_avx(auVar49,auVar27);
  auVar49 = vshufpd_avx(auVar27,auVar27,1);
  auVar27 = vminps_avx(auVar49,auVar27);
  auVar28 = vinsertps_avx(auVar28,auVar27,0x1c);
  auVar27 = vblendvps_avx(auVar57,auVar68._0_16_,auVar53);
  auVar49 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vminps_avx(auVar49,auVar27);
  auVar49 = vshufpd_avx(auVar27,auVar27,1);
  auVar27 = vminps_avx(auVar49,auVar27);
  auVar48 = vinsertps_avx(auVar28,auVar27,0x20);
  auVar31._8_4_ = 0xff800000;
  auVar31._0_8_ = 0xff800000ff800000;
  auVar31._12_4_ = 0xff800000;
  auVar27 = vblendvps_avx(auVar31,auVar66._0_16_,auVar53);
  auVar28 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar28 = vmaxps_avx(auVar28,auVar27);
  auVar49 = vshufpd_avx(auVar28,auVar28,1);
  auVar27 = vblendvps_avx(auVar31,auVar67._0_16_,auVar53);
  auVar28 = vmaxps_avx(auVar49,auVar28);
  auVar49 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vmaxps_avx(auVar49,auVar27);
  auVar49 = vshufpd_avx(auVar27,auVar27,1);
  auVar27 = vmaxps_avx(auVar49,auVar27);
  auVar28 = vinsertps_avx(auVar28,auVar27,0x1c);
  auVar27 = vblendvps_avx(auVar31,auVar68._0_16_,auVar53);
  auVar49 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vmaxps_avx(auVar49,auVar27);
  auVar49 = vshufpd_avx(auVar27,auVar27,1);
  auVar27 = vmaxps_avx(auVar49,auVar27);
  auVar47 = vinsertps_avx(auVar28,auVar27,0x20);
  auVar40 = vcmpps_avx(auVar48,_DAT_01feba10,5);
  auVar27 = vblendvps_avx(auVar47,auVar48,auVar40);
  auVar28 = vmovshdup_avx(auVar27);
  uVar24 = (ulong)(auVar28._0_4_ < 0.0) << 4 | 0x20;
  auVar28 = vshufpd_avx(auVar27,auVar27,1);
  uVar26 = (ulong)(auVar28._0_4_ < 0.0) << 4 | 0x40;
  auVar28 = vblendvps_avx(auVar57,auVar63._0_16_,auVar53);
  auVar49 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar49,auVar28);
  auVar49 = vshufpd_avx(auVar28,auVar28,1);
  auVar49 = vminps_avx(auVar49,auVar28);
  auVar28 = vblendvps_avx(auVar57,auVar64._0_16_,auVar53);
  auVar46 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar46,auVar28);
  auVar46 = vshufpd_avx(auVar28,auVar28,1);
  auVar28 = vminps_avx(auVar46,auVar28);
  auVar49 = vinsertps_avx(auVar49,auVar28,0x1c);
  auVar28 = vblendvps_avx(auVar57,auVar65._0_16_,auVar53);
  auVar46 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar46,auVar28);
  auVar46 = vshufpd_avx(auVar28,auVar28,1);
  auVar28 = vminps_avx(auVar46,auVar28);
  auVar49 = vinsertps_avx(auVar49,auVar28,0x20);
  auVar28 = vblendvps_avx(auVar31,auVar63._0_16_,auVar53);
  auVar46 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar46,auVar28);
  auVar46 = vshufpd_avx(auVar28,auVar28,1);
  auVar46 = vmaxps_avx(auVar46,auVar28);
  auVar28 = vblendvps_avx(auVar31,auVar64._0_16_,auVar53);
  auVar54 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar54,auVar28);
  auVar54 = vshufpd_avx(auVar28,auVar28,1);
  auVar28 = vmaxps_avx(auVar54,auVar28);
  auVar46 = vinsertps_avx(auVar46,auVar28,0x1c);
  auVar28 = vblendvps_avx(auVar31,auVar65._0_16_,auVar53);
  auVar54 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar54,auVar28);
  auVar54 = vshufpd_avx(auVar28,auVar28,1);
  auVar28 = vmaxps_avx(auVar54,auVar28);
  auVar46 = vinsertps_avx(auVar46,auVar28,0x20);
  auVar28 = vblendvps_avx(auVar46,auVar49,auVar40);
  auVar49 = vblendvps_avx(auVar49,auVar46,auVar40);
  bi_10.field_0 =
       (anon_union_16_2_9473010e_for_vint_impl<4>_1)vblendvps_avx(auVar31,local_10e8,auVar53);
  auVar46 = vshufps_avx((undefined1  [16])bi_10.field_0,(undefined1  [16])bi_10.field_0,0xb1);
  auVar46 = vmaxps_avx(auVar46,(undefined1  [16])bi_10.field_0);
  auVar54 = vshufpd_avx(auVar46,auVar46,1);
  local_f88 = vblendvps_avx(auVar57,local_10d8,auVar53);
  auVar53 = vshufps_avx(local_f88,local_f88,0xb1);
  auVar53 = vminps_avx(auVar53,local_f88);
  auVar46 = vmaxss_avx(auVar54,auVar46);
  auVar40 = vblendvps_avx(auVar48,auVar47,auVar40);
  auVar41._0_4_ = auVar49._0_4_ * auVar27._0_4_;
  auVar41._4_4_ = auVar49._4_4_ * auVar27._4_4_;
  auVar41._8_4_ = auVar49._8_4_ * auVar27._8_4_;
  auVar41._12_4_ = auVar49._12_4_ * auVar27._12_4_;
  auVar49._0_4_ = auVar28._0_4_ * auVar40._0_4_;
  auVar49._4_4_ = auVar28._4_4_ * auVar40._4_4_;
  auVar49._8_4_ = auVar28._8_4_ * auVar40._8_4_;
  auVar49._12_4_ = auVar28._12_4_ * auVar40._12_4_;
  uVar17 = (ulong)(auVar27._0_4_ < 0.0) * 0x10;
  stack[0].ptr.ptr = *(size_t *)&pAVar6[1].bounds.bounds0.lower.field_0;
  stack[0].dist = 0;
  _local_f98 = vshufps_avx(auVar27,auVar27,0);
  local_fa8 = vshufps_avx(auVar41,auVar41,0);
  _local_fb8 = vshufps_avx(auVar27,auVar27,0x55);
  local_fc8 = vshufps_avx(auVar41,auVar41,0x55);
  _local_fd8 = vshufps_avx(auVar27,auVar27,0xaa);
  local_fe8 = vshufps_avx(auVar41,auVar41,0xaa);
  _local_ff8 = vshufps_avx(auVar40,auVar40,0);
  local_1008 = vshufps_avx(auVar49,auVar49,0);
  _local_1018 = vshufps_avx(auVar40,auVar40,0x55);
  auVar27 = vshufps_avx(auVar53,auVar53,0);
  auVar28 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar62 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
  local_1028 = vminps_avx(auVar28,auVar27);
  local_1038 = vshufps_avx(auVar49,auVar49,0x55);
  _local_1048 = vshufps_avx(auVar40,auVar40,0xaa);
  local_1058 = vshufps_avx(auVar49,auVar49,0xaa);
  pSVar25 = stack + 1;
  do {
    local_1158 = vshufps_avx(auVar46,auVar46,0);
LAB_0037be13:
    do {
      do {
        if (pSVar25 == stack) {
          if (uVar19 == 0) {
            return;
          }
          goto LAB_0037bac3;
        }
        uVar13 = pSVar25[-1].dist;
        auVar28._4_4_ = uVar13;
        auVar28._0_4_ = uVar13;
        auVar28._8_4_ = uVar13;
        auVar28._12_4_ = uVar13;
        auVar30 = ZEXT1664(auVar28);
        pSVar25 = pSVar25 + -1;
        auVar27 = vcmpps_avx(auVar28,(undefined1  [16])bi_10.field_0,1);
      } while ((((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               -1 < auVar27[0xf]);
      sVar23 = (pSVar25->ptr).ptr;
      while ((sVar23 & 8) == 0) {
        pfVar4 = (float *)(sVar23 + 0x20 + uVar17);
        auVar32._0_4_ = (float)local_f98._0_4_ * *pfVar4;
        auVar32._4_4_ = (float)local_f98._4_4_ * pfVar4[1];
        auVar32._8_4_ = fStack_f90 * pfVar4[2];
        auVar32._12_4_ = fStack_f8c * pfVar4[3];
        pfVar4 = (float *)(sVar23 + 0x20 + uVar24);
        auVar36._0_4_ = (float)local_fb8._0_4_ * *pfVar4;
        auVar36._4_4_ = (float)local_fb8._4_4_ * pfVar4[1];
        auVar36._8_4_ = fStack_fb0 * pfVar4[2];
        auVar36._12_4_ = fStack_fac * pfVar4[3];
        auVar27 = vsubps_avx(auVar32,local_fa8);
        auVar28 = vsubps_avx(auVar36,local_fc8);
        pfVar4 = (float *)(sVar23 + 0x20 + uVar26);
        auVar42._0_4_ = (float)local_fd8._0_4_ * *pfVar4;
        auVar42._4_4_ = (float)local_fd8._4_4_ * pfVar4[1];
        auVar42._8_4_ = fStack_fd0 * pfVar4[2];
        auVar42._12_4_ = fStack_fcc * pfVar4[3];
        auVar27 = vpmaxsd_avx(auVar27,auVar28);
        auVar28 = vsubps_avx(auVar42,local_fe8);
        auVar28 = vpmaxsd_avx(auVar28,local_1028);
        fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vpmaxsd_avx(auVar27,auVar28);
        pfVar4 = (float *)(sVar23 + 0x20 + (uVar17 ^ 0x10));
        auVar37._0_4_ = (float)local_ff8._0_4_ * *pfVar4;
        auVar37._4_4_ = (float)local_ff8._4_4_ * pfVar4[1];
        auVar37._8_4_ = fStack_ff0 * pfVar4[2];
        auVar37._12_4_ = fStack_fec * pfVar4[3];
        pfVar4 = (float *)(sVar23 + 0x20 + (uVar24 ^ 0x10));
        auVar43._0_4_ = (float)local_1018._0_4_ * *pfVar4;
        auVar43._4_4_ = (float)local_1018._4_4_ * pfVar4[1];
        auVar43._8_4_ = fStack_1010 * pfVar4[2];
        auVar43._12_4_ = fStack_100c * pfVar4[3];
        auVar27 = vsubps_avx(auVar37,local_1008);
        auVar28 = vsubps_avx(auVar43,local_1038);
        pfVar4 = (float *)(sVar23 + 0x20 + (uVar26 ^ 0x10));
        auVar50._0_4_ = (float)local_1048._0_4_ * *pfVar4;
        auVar50._4_4_ = (float)local_1048._4_4_ * pfVar4[1];
        auVar50._8_4_ = fStack_1040 * pfVar4[2];
        auVar50._12_4_ = fStack_103c * pfVar4[3];
        auVar27 = vpminsd_avx(auVar27,auVar28);
        auVar28 = vsubps_avx(auVar50,local_1058);
        auVar28 = vpminsd_avx(auVar28,local_1158);
        auVar27 = vpminsd_avx(auVar27,auVar28);
        auVar27 = vcmpps_avx((undefined1  [16])fmin.field_0,auVar27,2);
        uVar13 = vmovmskps_avx(auVar27);
        if (uVar13 == 0) {
          bVar12 = false;
          sVar15 = sVar23;
        }
        else {
          uVar21 = (ulong)(uVar13 & 0xff);
          auVar30 = ZEXT1664(auVar62._0_16_);
          uVar22 = 0;
          sVar14 = 8;
          do {
            lVar20 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
            uVar18 = *(undefined4 *)(sVar23 + 0x20 + lVar20 * 4);
            auVar33._4_4_ = uVar18;
            auVar33._0_4_ = uVar18;
            auVar33._8_4_ = uVar18;
            auVar33._12_4_ = uVar18;
            auVar27 = vsubps_avx(auVar33,auVar63._0_16_);
            auVar34._0_4_ = auVar66._0_4_ * auVar27._0_4_;
            auVar34._4_4_ = auVar66._4_4_ * auVar27._4_4_;
            auVar34._8_4_ = auVar66._8_4_ * auVar27._8_4_;
            auVar34._12_4_ = auVar66._12_4_ * auVar27._12_4_;
            uVar18 = *(undefined4 *)(sVar23 + 0x40 + lVar20 * 4);
            auVar38._4_4_ = uVar18;
            auVar38._0_4_ = uVar18;
            auVar38._8_4_ = uVar18;
            auVar38._12_4_ = uVar18;
            auVar27 = vsubps_avx(auVar38,auVar64._0_16_);
            auVar39._0_4_ = auVar67._0_4_ * auVar27._0_4_;
            auVar39._4_4_ = auVar67._4_4_ * auVar27._4_4_;
            auVar39._8_4_ = auVar67._8_4_ * auVar27._8_4_;
            auVar39._12_4_ = auVar67._12_4_ * auVar27._12_4_;
            uVar18 = *(undefined4 *)(sVar23 + 0x60 + lVar20 * 4);
            auVar44._4_4_ = uVar18;
            auVar44._0_4_ = uVar18;
            auVar44._8_4_ = uVar18;
            auVar44._12_4_ = uVar18;
            auVar27 = vsubps_avx(auVar44,auVar65._0_16_);
            auVar45._0_4_ = auVar68._0_4_ * auVar27._0_4_;
            auVar45._4_4_ = auVar68._4_4_ * auVar27._4_4_;
            auVar45._8_4_ = auVar68._8_4_ * auVar27._8_4_;
            auVar45._12_4_ = auVar68._12_4_ * auVar27._12_4_;
            uVar18 = *(undefined4 *)(sVar23 + 0x30 + lVar20 * 4);
            auVar51._4_4_ = uVar18;
            auVar51._0_4_ = uVar18;
            auVar51._8_4_ = uVar18;
            auVar51._12_4_ = uVar18;
            auVar27 = vsubps_avx(auVar51,auVar63._0_16_);
            auVar52._0_4_ = auVar66._0_4_ * auVar27._0_4_;
            auVar52._4_4_ = auVar66._4_4_ * auVar27._4_4_;
            auVar52._8_4_ = auVar66._8_4_ * auVar27._8_4_;
            auVar52._12_4_ = auVar66._12_4_ * auVar27._12_4_;
            uVar18 = *(undefined4 *)(sVar23 + 0x50 + lVar20 * 4);
            auVar55._4_4_ = uVar18;
            auVar55._0_4_ = uVar18;
            auVar55._8_4_ = uVar18;
            auVar55._12_4_ = uVar18;
            auVar27 = vsubps_avx(auVar55,auVar64._0_16_);
            auVar56._0_4_ = auVar67._0_4_ * auVar27._0_4_;
            auVar56._4_4_ = auVar67._4_4_ * auVar27._4_4_;
            auVar56._8_4_ = auVar67._8_4_ * auVar27._8_4_;
            auVar56._12_4_ = auVar67._12_4_ * auVar27._12_4_;
            uVar18 = *(undefined4 *)(sVar23 + 0x70 + lVar20 * 4);
            auVar59._4_4_ = uVar18;
            auVar59._0_4_ = uVar18;
            auVar59._8_4_ = uVar18;
            auVar59._12_4_ = uVar18;
            auVar27 = vsubps_avx(auVar59,auVar65._0_16_);
            auVar60._0_4_ = auVar68._0_4_ * auVar27._0_4_;
            auVar60._4_4_ = auVar68._4_4_ * auVar27._4_4_;
            auVar60._8_4_ = auVar68._8_4_ * auVar27._8_4_;
            auVar60._12_4_ = auVar68._12_4_ * auVar27._12_4_;
            auVar27 = vpminsd_avx(auVar34,auVar52);
            auVar28 = vpminsd_avx(auVar39,auVar56);
            auVar27 = vpmaxsd_avx(auVar27,auVar28);
            auVar40 = vpminsd_avx(auVar45,auVar60);
            auVar28 = vpmaxsd_avx(auVar34,auVar52);
            auVar49 = vpmaxsd_avx(auVar39,auVar56);
            auVar48 = vpminsd_avx(auVar28,auVar49);
            auVar28 = vpmaxsd_avx(auVar45,auVar60);
            auVar49 = vpmaxsd_avx(auVar40,local_f88);
            auVar27 = vpmaxsd_avx(auVar27,auVar49);
            auVar28 = vpminsd_avx(auVar28,(undefined1  [16])bi_10.field_0);
            auVar28 = vpminsd_avx(auVar48,auVar28);
            auVar27 = vcmpps_avx(auVar27,auVar28,2);
            sVar15 = sVar14;
            if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar27[0xf] < '\0') {
              iVar5 = fmin.field_0.i[lVar20];
              auVar35._4_4_ = iVar5;
              auVar35._0_4_ = iVar5;
              auVar35._8_4_ = iVar5;
              auVar35._12_4_ = iVar5;
              sVar15 = *(size_t *)(sVar23 + lVar20 * 8);
              auVar28 = auVar30._0_16_;
              auVar27 = vcmpps_avx(auVar35,auVar28,1);
              if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar27[0xf]) {
                (pSVar25->ptr).ptr = sVar15;
                sVar15 = sVar14;
              }
              else {
                if (sVar14 == 8) {
                  auVar30 = ZEXT1664(auVar35);
                  goto LAB_0037c029;
                }
                (pSVar25->ptr).ptr = sVar14;
                auVar30 = ZEXT1664(auVar35);
                auVar35 = auVar28;
              }
              uVar22 = uVar22 + 1;
              pSVar25->dist = auVar35._0_4_;
              pSVar25 = pSVar25 + 1;
            }
LAB_0037c029:
            uVar21 = uVar21 & uVar21 - 1;
            sVar14 = sVar15;
          } while (uVar21 != 0);
          if (sVar15 == 8) {
            bVar12 = false;
          }
          else {
            bVar12 = true;
            if (1 < uVar22) {
              pSVar1 = pSVar25 + -2;
              pSVar2 = pSVar25 + -1;
              if (pSVar25[-2].dist < pSVar25[-1].dist) {
                sVar23 = (pSVar1->ptr).ptr;
                uVar11 = *(undefined8 *)&pSVar25[-2].dist;
                pSVar25[-2].dist = pSVar25[-1].dist;
                (pSVar1->ptr).ptr = (pSVar2->ptr).ptr;
                (pSVar2->ptr).ptr = sVar23;
                local_11a8.geometryUserPtr._0_4_ = (uint)uVar11;
                pSVar25[-1].dist = (uint)local_11a8.geometryUserPtr;
              }
              if (uVar22 != 2) {
                pSVar3 = pSVar25 + -3;
                if (pSVar25[-3].dist < pSVar25[-1].dist) {
                  sVar23 = (pSVar3->ptr).ptr;
                  uVar11 = *(undefined8 *)&pSVar25[-3].dist;
                  pSVar25[-3].dist = pSVar25[-1].dist;
                  (pSVar3->ptr).ptr = (pSVar2->ptr).ptr;
                  (pSVar2->ptr).ptr = sVar23;
                  local_11a8.geometryUserPtr._0_4_ = (uint)uVar11;
                  pSVar25[-1].dist = (uint)local_11a8.geometryUserPtr;
                }
                if (pSVar25[-3].dist < pSVar25[-2].dist) {
                  sVar23 = (pSVar3->ptr).ptr;
                  uVar11 = *(undefined8 *)&pSVar25[-3].dist;
                  pSVar25[-3].dist = pSVar25[-2].dist;
                  (pSVar3->ptr).ptr = (pSVar1->ptr).ptr;
                  (pSVar1->ptr).ptr = sVar23;
                  local_11a8.geometryUserPtr._0_4_ = (uint)uVar11;
                  pSVar25[-2].dist = (uint)local_11a8.geometryUserPtr;
                }
              }
            }
          }
        }
        sVar23 = sVar15;
        if (!bVar12) goto LAB_0037be13;
      }
      auVar27 = vcmpps_avx((undefined1  [16])bi_10.field_0,auVar30._0_16_,6);
      auVar30 = ZEXT1664(auVar27);
      if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar27[0xf])
      goto LAB_0037be13;
      uVar21 = (ulong)((uint)sVar23 & 0xf);
      if (uVar21 != 8) {
        lVar20 = 0;
        local_1068 = auVar27;
        do {
          local_11a8.geomID = *(uint *)((sVar23 & 0xfffffffffffffff0) + lVar20 * 8);
          local_1178 = (context->scene->geometries).items[local_11a8.geomID].ptr;
          uVar13 = local_1178->mask;
          auVar29._4_4_ = uVar13;
          auVar29._0_4_ = uVar13;
          auVar29._8_4_ = uVar13;
          auVar29._12_4_ = uVar13;
          auVar27 = vandps_avx(auVar29,*(undefined1 (*) [16])(ray + 0x90));
          auVar27 = vpcmpeqd_avx(auVar27,_DAT_01feba10);
          auVar28 = auVar30._0_16_ & ~auVar27;
          if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar28[0xf] < '\0') {
            fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vandnps_avx(auVar27,auVar30._0_16_);
            local_11a8.primID = *(uint *)((sVar23 & 0xfffffffffffffff0) + 4 + lVar20 * 8);
            local_11a8.valid = (int *)&fmin;
            local_11a8.geometryUserPtr = local_1178->userPtr;
            local_11a8.context = context->user;
            local_11a8.N = 4;
            local_1170 = 0;
            local_1168 = context->args;
            pp_Var16 = (_func_int **)local_1168->intersect;
            if (pp_Var16 == (_func_int **)0x0) {
              pp_Var16 = local_1178[1].super_RefCount._vptr_RefCount;
            }
            local_11a8.rayhit = (RTCRayHitN *)ray;
            (*(code *)pp_Var16)(&local_11a8);
            auVar63 = ZEXT1664(local_1078);
            auVar64 = ZEXT1664(local_1088);
            auVar65 = ZEXT1664(local_1098);
            auVar66 = ZEXT1664(local_10a8);
            auVar67 = ZEXT1664(local_10b8);
            auVar68 = ZEXT1664(local_10c8);
            auVar62 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar30 = ZEXT1664(local_1068);
          }
          auVar27 = auVar30._0_16_;
          lVar20 = lVar20 + 1;
        } while (uVar21 - 8 != lVar20);
      }
      auVar28 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),(undefined1  [16])bi_10.field_0,1);
      auVar28 = auVar27 & auVar28;
    } while ((((auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             -1 < auVar28[0xf]);
    bi_10.field_0 =
         (anon_union_16_2_9473010e_for_vint_impl<4>_1)
         vblendvps_avx((undefined1  [16])bi_10.field_0,*(undefined1 (*) [16])(ray + 0x80),auVar27);
    auVar27 = vshufps_avx((undefined1  [16])bi_10.field_0,(undefined1  [16])bi_10.field_0,0xb1);
    auVar27 = vmaxps_avx(auVar27,(undefined1  [16])bi_10.field_0);
    auVar28 = vshufpd_avx(auVar27,auVar27,1);
    auVar46 = vmaxss_avx(auVar28,auVar27);
  } while( true );
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }